

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_iterator.hpp
# Opt level: O0

bool __thiscall
burst::
subset_iterator<boost::range_detail::integer_iterator<int>,_std::less<void>,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
::equal(subset_iterator<boost::range_detail::integer_iterator<int>,_std::less<void>,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
        *this,subset_iterator<boost::range_detail::integer_iterator<int>,_std::less<void>,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
              *that)

{
  type_conflict4 tVar1;
  bool bVar2;
  const_iterator __first1;
  __normal_iterator<const_boost::range_detail::integer_iterator<int>_*,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
  __last1;
  const_iterator __first2;
  __normal_iterator<const_boost::range_detail::integer_iterator<int>_*,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
  __last2;
  subset_iterator<boost::range_detail::integer_iterator<int>,_std::less<void>,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
  *that_local;
  subset_iterator<boost::range_detail::integer_iterator<int>,_std::less<void>,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
  *this_local;
  
  tVar1 = boost::iterators::operator==
                    ((iterator_facade<boost::range_detail::integer_iterator<int>,_int,_boost::iterators::random_access_traversal_tag,_int,_long>
                      *)this,(iterator_facade<boost::range_detail::integer_iterator<int>,_int,_boost::iterators::random_access_traversal_tag,_int,_long>
                              *)that);
  if (!tVar1) {
    __assert_fail("this->m_begin == that.m_begin",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subset_iterator.hpp"
                  ,0x81,
                  "bool burst::subset_iterator<boost::range_detail::integer_iterator<int>>::equal(const subset_iterator<ForwardIterator, Compare, SubsetContainer> &) const [ForwardIterator = boost::range_detail::integer_iterator<int>, Compare = std::less<void>, SubsetContainer = std::vector<boost::range_detail::integer_iterator<int>>]"
                 );
  }
  tVar1 = boost::iterators::operator==
                    ((iterator_facade<boost::range_detail::integer_iterator<int>,_int,_boost::iterators::random_access_traversal_tag,_int,_long>
                      *)&this->m_end,
                     (iterator_facade<boost::range_detail::integer_iterator<int>,_int,_boost::iterators::random_access_traversal_tag,_int,_long>
                      *)&that->m_end);
  if (!tVar1) {
    __assert_fail("this->m_end == that.m_end",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subset_iterator.hpp"
                  ,0x82,
                  "bool burst::subset_iterator<boost::range_detail::integer_iterator<int>>::equal(const subset_iterator<ForwardIterator, Compare, SubsetContainer> &) const [ForwardIterator = boost::range_detail::integer_iterator<int>, Compare = std::less<void>, SubsetContainer = std::vector<boost::range_detail::integer_iterator<int>>]"
                 );
  }
  __first1 = subset_begin(this);
  __last1 = subset_end(this);
  __first2 = subset_begin(that);
  __last2 = subset_end(that);
  bVar2 = std::
          equal<__gnu_cxx::__normal_iterator<boost::range_detail::integer_iterator<int>const*,std::vector<boost::range_detail::integer_iterator<int>,std::allocator<boost::range_detail::integer_iterator<int>>>>,__gnu_cxx::__normal_iterator<boost::range_detail::integer_iterator<int>const*,std::vector<boost::range_detail::integer_iterator<int>,std::allocator<boost::range_detail::integer_iterator<int>>>>>
                    ((__normal_iterator<const_boost::range_detail::integer_iterator<int>_*,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
                      )__first1._M_current,__last1,
                     (__normal_iterator<const_boost::range_detail::integer_iterator<int>_*,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
                      )__first2._M_current,__last2);
  return bVar2;
}

Assistant:

bool equal (const subset_iterator & that) const
        {
            BOOST_ASSERT(this->m_begin == that.m_begin);
            BOOST_ASSERT(this->m_end == that.m_end);
            return
                std::equal
                (
                    this->subset_begin(), this->subset_end(),
                    that.subset_begin(), that.subset_end()
                );
        }